

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode gzip_init_writer(connectdata *conn,contenc_writer *writer)

{
  int iVar1;
  CURLcode CVar2;
  z_stream *z_00;
  char *__s1;
  z_stream *z;
  zlib_params *zp;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  z_00 = (z_stream *)(writer + 1);
  if (writer->downstream == (contenc_writer *)0x0) {
    conn_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    writer[3].params = zalloc_cb;
    writer[4].handler = (content_encoding *)zfree_cb;
    __s1 = (char *)zlibVersion();
    iVar1 = strcmp(__s1,"1.2.0.4");
    if (iVar1 < 0) {
      iVar1 = inflateInit2_(z_00,0xfffffff1,"1.2.11",0x70);
      if (iVar1 != 0) {
        CVar2 = process_zlib_error(conn,z_00);
        return CVar2;
      }
      *(undefined4 *)((long)&writer->params + 4) = 8;
      *(undefined4 *)&writer->params = 1;
    }
    else {
      iVar1 = inflateInit2_(z_00,0x2f,"1.2.11",0x70);
      if (iVar1 != 0) {
        CVar2 = process_zlib_error(conn,z_00);
        return CVar2;
      }
      *(undefined4 *)&writer->params = 6;
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode gzip_init_writer(struct connectdata *conn,
                                 struct contenc_writer *writer)
{
  struct zlib_params *zp = (struct zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
    /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
    if(inflateInit2(z, MAX_WBITS + 32) != Z_OK) {
      return process_zlib_error(conn, z);
    }
    zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  }
  else {
    /* we must parse the gzip header and trailer ourselves */
    if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
      return process_zlib_error(conn, z);
    }
    zp->trailerlen = 8; /* A CRC-32 and a 32-bit input size (RFC 1952, 2.2) */
    zp->zlib_init = ZLIB_INIT; /* Initial call state */
  }

  return CURLE_OK;
}